

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O3

char * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::alloc
          (Allocator<mecab_node_t,_mecab_path_t> *this,size_t size)

{
  ChunkFreeList<char> *this_00;
  char *pcVar1;
  
  this_00 = (this->char_freelist_).ptr_;
  if (this_00 == (ChunkFreeList<char> *)0x0) {
    this_00 = (ChunkFreeList<char> *)operator_new(0x38);
    this_00->_vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_0013ff00;
    (this_00->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->pi_ = 0;
    this_00->li_ = 0;
    this_00->default_size = 0x2000;
    (this->char_freelist_).ptr_ = this_00;
  }
  pcVar1 = ChunkFreeList<char>::alloc(this_00,size + 1);
  return pcVar1;
}

Assistant:

char *alloc(size_t size) {
    if (!char_freelist_.get()) {
      char_freelist_.reset(new ChunkFreeList<char>(BUF_SIZE));
    }
    return char_freelist_->alloc(size + 1);
  }